

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

PatternList *
parse_expr(PatternList *__return_storage_ptr__,Tokens *tokens,
          vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  pointer *__return_storage_ptr___00;
  pointer psVar1;
  int iVar2;
  string *psVar3;
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  string local_c8;
  undefined1 auStack_a8 [8];
  PatternList ret;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_88;
  pointer local_80;
  undefined1 auStack_78 [8];
  PatternList seq;
  PatternList local_58;
  undefined1 local_31;
  
  seq.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  parse_seq((PatternList *)auStack_78,tokens,options);
  psVar3 = Tokens::current_abi_cxx11_(tokens);
  iVar2 = std::__cxx11::string::compare((char *)psVar3);
  if (iVar2 == 0) {
    auStack_a8 = (undefined1  [8])0x0;
    ret.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ret.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    maybe_collapse_to_required(&local_58);
    std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
    emplace_back<std::shared_ptr<docopt::Pattern>>
              ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                *)auStack_a8,(shared_ptr<docopt::Pattern> *)&local_58);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_58.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_58.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    __return_storage_ptr___00 =
         &ret.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    while( true ) {
      psVar3 = Tokens::current_abi_cxx11_(tokens);
      iVar2 = std::__cxx11::string::compare((char *)psVar3);
      if (iVar2 != 0) break;
      Tokens::pop_abi_cxx11_(&local_c8,tokens);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      parse_seq((PatternList *)__return_storage_ptr___00,tokens,options);
      local_58.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           seq.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_58.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           seq.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_58.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_78;
      auStack_78 = (undefined1  [8])
                   ret.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
      seq.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Stack_88;
      seq.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_80;
      ret.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Stack_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_80 = (pointer)0x0;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_58);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)__return_storage_ptr___00);
      maybe_collapse_to_required(&local_58);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Pattern>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)auStack_a8,(shared_ptr<docopt::Pattern> *)&local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_58.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_58.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    if ((long)ret.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 == 0x10) {
      ret.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8)->
                    _M_ptr;
      p_Stack_88 = (((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8)->
                   _M_refcount)._M_pi;
      (((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8)->_M_refcount)._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8)->_M_ptr =
           (element_type *)0x0;
    }
    else {
      local_58.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<docopt::Either,std::allocator<docopt::Either>,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_58.
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,(Either **)&local_58,
                 (allocator<docopt::Either> *)&local_31,
                 (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)auStack_a8);
      ret.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_58.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      p_Stack_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_58.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    }
    __l._M_len = 1;
    __l._M_array = (iterator)
                   &ret.
                    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)seq.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,(allocator_type *)&local_58);
    if (p_Stack_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_88);
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)auStack_a8);
  }
  else {
    ((seq.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
    super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)auStack_78;
    ((seq.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
    super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         seq.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    seq.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
    super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         seq.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    auStack_78 = (undefined1  [8])0x0;
    seq.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    seq.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  psVar1 = seq.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)auStack_78);
  return (PatternList *)psVar1;
}

Assistant:

PatternList parse_expr(Tokens& tokens, std::vector<Option>& options)
{
	// expr ::= seq ( '|' seq )* ;

	auto seq = parse_seq(tokens, options);

	if (tokens.current() != "|")
		return seq;

	PatternList ret;
	ret.emplace_back(maybe_collapse_to_required(std::move(seq)));

	while (tokens.current() == "|") {
		tokens.pop();
		seq = parse_seq(tokens, options);
		ret.emplace_back(maybe_collapse_to_required(std::move(seq)));
	}

	return { maybe_collapse_to_either(std::move(ret)) };
}